

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
          (View<float,false,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end)

{
  pointer data;
  bool assertion;
  long lVar1;
  unsigned_long *puVar2;
  allocator_type local_29;
  
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  assertion = View<float,_false,_std::allocator<unsigned_long>_>::isSimple
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  marray_detail::Assert<bool>(assertion);
  lVar1 = 1;
  for (puVar2 = begin; puVar2 != end; puVar2 = puVar2 + 1) {
    lVar1 = lVar1 * *puVar2;
  }
  marray_detail::Assert<bool>(lVar1 == *(long *)(this + 0x30));
  data = *(pointer *)this;
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  assign<unsigned_long*>
            (this,begin,end,data,(CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),
             &local_29);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::reshape
(
    ShapeIterator begin,
    ShapeIterator end
)
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || isSimple());
    if(!MARRAY_NO_ARG_TEST) {
        std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
            std::multiplies<std::size_t>());
        marray_detail::Assert(size == this->size());
    }
    assign(begin, end, data_, coordinateOrder(), coordinateOrder());
    testInvariant();
}